

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O0

bool __thiscall
MetaCommand::AddField
          (MetaCommand *this,string *name,string *description,TypeEnumType type,
          DataEnumType externalData,string *rangeMin,string *rangeMax)

{
  undefined4 in_ECX;
  value_type *in_RDX;
  string *in_RSI;
  undefined4 in_R8D;
  Field *in_R9;
  string *in_stack_00000008;
  Field field;
  Option option;
  string local_168 [96];
  undefined4 local_108;
  undefined4 local_104;
  string local_100 [32];
  string local_e0 [32];
  undefined1 local_c0;
  undefined1 local_bf;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [56];
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  Option::Option((Option *)in_R9);
  std::__cxx11::string::operator=(local_68,"");
  Field::Field(in_R9);
  std::__cxx11::string::operator=(local_168,in_RSI);
  local_108 = local_1c;
  local_c0 = 1;
  local_bf = 0;
  local_104 = local_20;
  std::__cxx11::string::operator=(local_100,(string *)in_R9);
  std::__cxx11::string::operator=(local_e0,in_stack_00000008);
  std::vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>::push_back
            ((vector<MetaCommand::Field,_std::allocator<MetaCommand::Field>_> *)in_RSI,in_RDX);
  local_30 = 1;
  std::__cxx11::string::operator=(local_a8,in_RSI);
  std::__cxx11::string::operator=(local_88,(string *)in_RDX);
  local_2f = 0;
  local_2e = 0;
  std::vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>::push_back
            ((vector<MetaCommand::Option,_std::allocator<MetaCommand::Option>_> *)in_RSI,
             (value_type *)in_RDX);
  Field::~Field(in_R9);
  Option::~Option((Option *)in_R9);
  return true;
}

Assistant:

bool MetaCommand::AddField(METAIO_STL::string name,
                           METAIO_STL::string description,
                           TypeEnumType type,
                           DataEnumType externalData,
                           METAIO_STL::string rangeMin,
                           METAIO_STL::string rangeMax)
{
  // need to add some tests here to check if the option is not defined yet
  Option option;
  option.tag = "";

  // Create a field without description with the specified type
  Field field;
  field.name = name;
  field.type = type;
  field.required = true;
  field.userDefined = false;
  field.externaldata = externalData;
  field.rangeMin = rangeMin;
  field.rangeMax = rangeMax;
  option.fields.push_back(field);

  option.required = true;
  option.name = name;
  option.description = description;
  option.userDefined = false;
  option.complete = false;

  m_OptionVector.push_back(option);
  return true;
}